

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O3

void guess_ca_certs(char *filename,X509_NAME *issuer_name,X509 **sigc,X509 **encc,X509 **issuer_cert
                   )

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  X509 *pXVar5;
  X509_NAME *pXVar6;
  X509_NAME *pXVar7;
  int *piVar8;
  X509 **ppXVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  X509 *cert [20];
  char name [1024];
  X509 *local_4d8 [20];
  char local_438 [1032];
  
  uVar13 = 0;
  do {
    if (uVar13 == 0x14) {
      *encc = (X509 *)local_4d8[0];
      *sigc = (X509 *)local_4d8[0];
      uVar12 = 0x14;
      goto LAB_0010e33e;
    }
    snprintf(local_438,0x3ff,"%s-%d",filename,uVar13 & 0xffffffff);
    pXVar5 = (X509 *)read_cert(local_438);
    local_4d8[uVar13] = pXVar5;
    uVar13 = uVar13 + 1;
  } while (pXVar5 != (X509 *)0x0);
  *encc = (X509 *)local_4d8[0];
  *sigc = (X509 *)local_4d8[0];
  if (uVar13 != 1) {
    uVar12 = (int)uVar13 - 1;
LAB_0010e33e:
    uVar13 = (ulong)uVar12;
    uVar14 = 0;
    do {
      pXVar5 = local_4d8[uVar14];
      pXVar6 = X509_get_subject_name(pXVar5);
      pXVar7 = X509_get_issuer_name(local_4d8[0]);
      iVar4 = X509_NAME_cmp(pXVar6,pXVar7);
      if (iVar4 == 0) {
        bVar15 = true;
      }
      else {
        uVar3 = 1;
        do {
          uVar11 = uVar3;
          if (uVar13 == uVar11) break;
          pXVar7 = X509_get_issuer_name(local_4d8[uVar11]);
          iVar4 = X509_NAME_cmp(pXVar6,pXVar7);
          uVar3 = uVar11 + 1;
        } while (iVar4 != 0);
        bVar15 = uVar11 < uVar13;
      }
      if ((issuer_name != (X509_NAME *)0x0) &&
         (iVar4 = X509_NAME_cmp((X509_NAME *)issuer_name,pXVar6), iVar4 == 0)) {
        *issuer_cert = (X509 *)pXVar5;
      }
      if (!bVar15) {
        piVar8 = (int *)X509_get_ext_d2i(pXVar5,0x53,(int *)0x0,(int *)0x0);
        if ((piVar8 == (int *)0x0) || (*piVar8 < 1)) {
          *encc = (X509 *)pXVar5;
          ppXVar9 = sigc;
        }
        else {
          bVar1 = **(byte **)(piVar8 + 2);
          if ((char)bVar1 < '\0') {
            *sigc = (X509 *)pXVar5;
            bVar1 = **(byte **)(piVar8 + 2);
          }
          ppXVar9 = encc;
          if ((bVar1 & 0x20) == 0) goto LAB_0010e41b;
        }
        *ppXVar9 = (X509 *)pXVar5;
      }
LAB_0010e41b:
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13);
    uVar14 = 0;
    do {
      pXVar5 = local_4d8[uVar14];
      if (((pXVar5 != (X509 *)*sigc) && (pXVar5 != (X509 *)*encc)) &&
         (pXVar5 != (X509 *)*issuer_cert)) {
        X509_free(pXVar5);
      }
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  pcVar2 = pname;
  if (v_flag != 0) {
    if ((X509 *)*sigc != (X509 *)0x0) {
      pXVar6 = X509_get_subject_name((X509 *)*sigc);
      pcVar10 = X509_NAME_oneline(pXVar6,local_438,0x400);
      printf("%s: using RA certificate: %s\n",pcVar2,pcVar10);
    }
    pcVar2 = pname;
    if ((X509 *)*encc != (X509 *)0x0) {
      pXVar6 = X509_get_subject_name((X509 *)*encc);
      pcVar10 = X509_NAME_oneline(pXVar6,local_438,0x400);
      printf("%s: using RA encryption certificate: %s\n",pcVar2,pcVar10);
    }
    pcVar2 = pname;
    if ((X509 *)*issuer_cert != (X509 *)0x0) {
      pXVar6 = X509_get_subject_name((X509 *)*issuer_cert);
      pcVar10 = X509_NAME_oneline(pXVar6,local_438,0x400);
      printf("%s: using issuer certificate: %s\n",pcVar2,pcVar10);
    }
  }
  return;
}

Assistant:

void
guess_ca_certs(const char* filename, X509_NAME *issuer_name,
			   X509 **sigc, X509 **encc, X509 **issuer_cert)
{
	int ccnt, i, j;
	X509 *cert[20];

	ccnt = 0;
	/* read all certificates */
	while (ccnt < 20) {
		char name[1024];

		snprintf(name, sizeof(name)-1, "%s-%d", filename, ccnt);
		if (!(cert[ccnt] = read_cert(name)))
			break;

		ccnt++;
	}

	/* this is either NULL or the first certificate */
	*sigc = *encc = cert[0];

	for (i = 0; i < ccnt; i++) {
		X509_NAME *myname = X509_get_subject_name(cert[i]);
		int is_issuer = 0;

		/* the right CA is the final-one, either leaf or not */
		for (j = 0; j < ccnt; j++) {
			X509_NAME *issuer = X509_get_issuer_name(cert[j]);
			if (!X509_NAME_cmp(myname, issuer)) {
				is_issuer = 1;
				break;
			}
		}

		if (issuer_name != NULL && !X509_NAME_cmp(issuer_name, myname))
			*issuer_cert = cert[i];

		if (!is_issuer) {
			/* X509_get_key_usage(cert[i]) is not in older openssl */
			ASN1_BIT_STRING *usage = X509_get_ext_d2i(cert[i], NID_key_usage, NULL, NULL);
			if (usage && (usage->length > 0)) {
				if (usage->data[0] & KU_DIGITAL_SIGNATURE)
					*sigc = cert[i];
				if (usage->data[0] & KU_KEY_ENCIPHERMENT)
					*encc = cert[i];
			} else {
				/* no usability constraints */
				*sigc = *encc = cert[i];
			}
		}
	}

	/* release those we don't use */
	for (i = 0; i < ccnt; i++) {
		if (cert[i] != *sigc && cert[i] != *encc && cert[i] != *issuer_cert)
			X509_free(cert[i]);
	}

	if (v_flag) {
		char buffer[1024];

		if (*sigc)
			printf("%s: using RA certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*sigc),
						buffer, sizeof(buffer)));
		if (*encc)
			printf("%s: using RA encryption certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*encc),
						buffer, sizeof(buffer)));
		if (*issuer_cert)
			printf("%s: using issuer certificate: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(*issuer_cert),
						buffer, sizeof(buffer)));
	}

}